

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

double __thiscall doctest::detail::ResultBuilder::log(ResultBuilder *this,double __x)

{
  int *piVar1;
  Enum EVar2;
  undefined8 *puVar3;
  byte bVar4;
  bool bVar5;
  int iVar6;
  size_t sVar7;
  char *pcVar8;
  char *pcVar9;
  uint uVar10;
  String *pSVar11;
  IReporter **curr_rep;
  long lVar12;
  undefined8 *puVar13;
  undefined8 uVar14;
  long in_FS_OFFSET;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  uint extraout_XMM0_Da_01;
  uint extraout_XMM0_Da_02;
  uint extraout_XMM0_Da_03;
  uint extraout_XMM0_Da_04;
  undefined4 uVar15;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Da_07;
  undefined4 extraout_XMM0_Da_08;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 uVar16;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  anon_union_24_2_13149d16_for_String_2 local_a0;
  anon_union_24_2_13149d16_for_String_2 local_88;
  anon_union_24_2_13149d16_for_String_2 local_70;
  anon_union_24_2_13149d16_for_String_2 local_58;
  anon_union_24_2_13149d16_for_String_2 local_40;
  
  EVar2 = (this->super_AssertData).m_at;
  if ((EVar2 & is_throws) == 0) {
    if ((~EVar2 & 0x60) == 0) {
      if ((this->super_AssertData).m_threw_as == true) {
        pcVar9 = (this->super_AssertData).m_exception_string;
        sVar7 = strlen(pcVar9);
        pcVar8 = String::allocate((String *)&local_40.data,(uint)sVar7);
        memcpy(pcVar8,pcVar9,sVar7 & 0xffffffff);
        if ((this->super_AssertData).m_exception.field_0.buf[0x17] < '\0') {
          pSVar11 = (String *)(this->super_AssertData).m_exception.field_0.data.ptr;
        }
        else {
          pSVar11 = &(this->super_AssertData).m_exception;
        }
        uVar14 = &local_40;
        if (local_40.buf[0x17] < '\0') {
          uVar14 = local_40.data.ptr;
        }
        iVar6 = strcmp((char *)pSVar11,(char *)uVar14);
        __x = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
        (this->super_AssertData).m_failed = iVar6 != 0;
        if ((anon_union_24_2_13149d16_for_String_2 *)local_40.data.ptr !=
            (anon_union_24_2_13149d16_for_String_2 *)0x0 && local_40.buf[0x17] < '\0') {
          operator_delete__(local_40.data.ptr);
          __x = (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
        }
      }
      else {
        (this->super_AssertData).m_failed = true;
      }
      goto LAB_0010b729;
    }
    if ((EVar2 & is_throws_as) != 0) {
      bVar4 = (this->super_AssertData).m_threw_as;
      goto LAB_0010b6cd;
    }
    if ((EVar2 & is_throws_with) != 0) {
      pcVar9 = (this->super_AssertData).m_exception_string;
      sVar7 = strlen(pcVar9);
      pcVar8 = String::allocate((String *)&local_40.data,(uint)sVar7);
      memcpy(pcVar8,pcVar9,sVar7 & 0xffffffff);
      if ((this->super_AssertData).m_exception.field_0.buf[0x17] < '\0') {
        pSVar11 = (String *)(this->super_AssertData).m_exception.field_0.data.ptr;
      }
      else {
        pSVar11 = &(this->super_AssertData).m_exception;
      }
      uVar14 = &local_40;
      if (local_40.buf[0x17] < '\0') {
        uVar14 = local_40.data.ptr;
      }
      iVar6 = strcmp((char *)pSVar11,(char *)uVar14);
      __x = (double)CONCAT44(extraout_XMM0_Db_07,extraout_XMM0_Da_07);
      (this->super_AssertData).m_failed = iVar6 != 0;
      if ((anon_union_24_2_13149d16_for_String_2 *)local_40.data.ptr !=
          (anon_union_24_2_13149d16_for_String_2 *)0x0 && local_40.buf[0x17] < '\0') {
        operator_delete__(local_40.data.ptr);
        __x = (double)CONCAT44(extraout_XMM0_Db_08,extraout_XMM0_Da_08);
      }
      goto LAB_0010b729;
    }
    if (-1 < (char)EVar2) goto LAB_0010b729;
    bVar4 = (this->super_AssertData).m_threw;
  }
  else {
    bVar4 = (this->super_AssertData).m_threw;
LAB_0010b6cd:
    bVar4 = bVar4 ^ 1;
  }
  (this->super_AssertData).m_failed = (bool)bVar4;
LAB_0010b729:
  bVar4 = (this->super_AssertData).m_exception.field_0.buf[0x17];
  if ((char)bVar4 < '\0') {
    uVar10 = (this->super_AssertData).m_exception.field_0.data.size;
  }
  else {
    uVar10 = 0x17 - (bVar4 & 0x1f);
  }
  if (uVar10 != 0) {
    pSVar11 = &(this->super_AssertData).m_exception;
    pcVar9 = String::allocate((String *)&local_58.data,1);
    *pcVar9 = '\"';
    operator+((String *)&local_70.data,(String *)&local_58.data,pSVar11);
    pcVar9 = String::allocate((String *)&local_88.data,1);
    *pcVar9 = '\"';
    operator+((String *)&local_a0.data,(String *)&local_70.data,(String *)&local_88.data);
    uVar15 = extraout_XMM0_Da_01;
    uVar16 = extraout_XMM0_Db_01;
    if (&pSVar11->field_0 != &local_a0) {
      if (((this->super_AssertData).m_exception.field_0.buf[0x17] < '\0') &&
         (pcVar9 = (pSVar11->field_0).data.ptr, pcVar9 != (char *)0x0)) {
        operator_delete__(pcVar9);
      }
      uVar15 = local_a0._0_4_;
      *(ulong *)((long)&(this->super_AssertData).m_exception.field_0 + 0x10) =
           CONCAT17(local_a0.buf[0x17],local_a0._16_7_);
      *(undefined4 *)&pSVar11->field_0 = local_a0._0_4_;
      *(undefined4 *)((long)&(this->super_AssertData).m_exception.field_0 + 4) = local_a0._4_4_;
      (this->super_AssertData).m_exception.field_0.data.size = local_a0.data.size;
      (this->super_AssertData).m_exception.field_0.data.capacity = local_a0.data.capacity;
      local_a0._0_4_ = local_a0._0_4_ & 0xffffff00;
      local_a0.buf[0x17] = '\x17';
      uVar16 = local_a0._4_4_;
    }
    if ((local_a0.buf[0x17] < '\0') &&
       ((void *)CONCAT44(local_a0._4_4_,local_a0._0_4_) != (void *)0x0)) {
      operator_delete__((void *)CONCAT44(local_a0._4_4_,local_a0._0_4_));
      uVar15 = extraout_XMM0_Da_02;
      uVar16 = extraout_XMM0_Db_02;
    }
    if ((local_88.buf[0x17] < '\0') && (local_88.data.ptr != (char *)0x0)) {
      operator_delete__(local_88.data.ptr);
      uVar15 = extraout_XMM0_Da_03;
      uVar16 = extraout_XMM0_Db_03;
    }
    if ((local_70.buf[0x17] < '\0') && (local_70.data.ptr != (char *)0x0)) {
      operator_delete__(local_70.data.ptr);
      uVar15 = extraout_XMM0_Da_04;
      uVar16 = extraout_XMM0_Db_04;
    }
    __x = (double)CONCAT44(uVar16,uVar15);
    if ((local_58.buf[0x17] < '\0') &&
       (__x = (double)CONCAT44(uVar16,uVar15), local_58.data.ptr != (char *)0x0)) {
      operator_delete__(local_58.data.ptr);
      __x = (double)CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05);
    }
  }
  if (is_running_in_test == '\x01') {
    if (((this->super_AssertData).m_at & is_warn) == 0) {
      lVar12 = g_cs + 0xb8;
      if (*(char *)(in_FS_OFFSET + -0x1880) == '\0') {
        __x = log(__x);
      }
      LOCK();
      piVar1 = (int *)(lVar12 + *(long *)(in_FS_OFFSET + -0x1888) * 0x40);
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    puVar3 = *(undefined8 **)(g_cs + 0x10d8);
    for (puVar13 = *(undefined8 **)(g_cs + 0x10d0); puVar13 != puVar3; puVar13 = puVar13 + 1) {
      __x = (double)(**(code **)(*(long *)*puVar13 + 0x48))((long *)*puVar13,this);
    }
    if (((this->super_AssertData).m_failed != false) &&
       (((this->super_AssertData).m_at & is_warn) == 0)) {
      lVar12 = g_cs + 0x8b8;
      if (*(char *)(in_FS_OFFSET + -0x1880) == '\0') {
        __x = log(__x);
      }
      LOCK();
      piVar1 = (int *)(lVar12 + *(long *)(in_FS_OFFSET + -0x1888) * 0x40);
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
  }
  else if ((this->super_AssertData).m_failed == true) {
    if (*(code **)(g_cs + 0x10e8) == (code *)0x0) {
      abort();
    }
    __x = (double)(**(code **)(g_cs + 0x10e8))(this);
  }
  if ((this->super_AssertData).m_failed == true) {
    bVar5 = isDebuggerActive();
    __x = (double)CONCAT44(extraout_XMM0_Db_06,extraout_XMM0_Da_06);
    if (bVar5) {
      __x = (double)CONCAT44(extraout_XMM0_Db_06,extraout_XMM0_Da_06);
    }
  }
  return __x;
}

Assistant:

bool ResultBuilder::log() {
        if(m_at & assertType::is_throws) { //!OCLINT bitwise operator in conditional
            m_failed = !m_threw;
        } else if((m_at & assertType::is_throws_as) && (m_at & assertType::is_throws_with)) { //!OCLINT
            m_failed = !m_threw_as || (m_exception != m_exception_string);
        } else if(m_at & assertType::is_throws_as) { //!OCLINT bitwise operator in conditional
            m_failed = !m_threw_as;
        } else if(m_at & assertType::is_throws_with) { //!OCLINT bitwise operator in conditional
            m_failed = m_exception != m_exception_string;
        } else if(m_at & assertType::is_nothrow) { //!OCLINT bitwise operator in conditional
            m_failed = m_threw;
        }

        if(m_exception.size())
            m_exception = "\"" + m_exception + "\"";

        if(is_running_in_test) {
            addAssert(m_at);
            DOCTEST_ITERATE_THROUGH_REPORTERS(log_assert, *this);

            if(m_failed)
                addFailedAssert(m_at);
        } else if(m_failed) {
            failed_out_of_a_testing_context(*this);
        }

        return m_failed && isDebuggerActive() && !getContextOptions()->no_breaks &&
            (g_cs->currentTest == nullptr || !g_cs->currentTest->m_no_breaks); // break into debugger
    }